

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

optional<int> * __thiscall pstd::optional<int>::operator=(optional<int> *this,optional<int> *v)

{
  bool bVar1;
  optional<int> *this_00;
  aligned_storage_t<sizeof(int),_alignof(int)> *paVar2;
  optional<int> *in_RSI;
  optional<int> *in_RDI;
  optional<int> *in_stack_ffffffffffffffe0;
  
  reset(in_stack_ffffffffffffffe0);
  bVar1 = has_value(in_RSI);
  if (bVar1) {
    this_00 = (optional<int> *)ptr((optional<int> *)0x6e95b7);
    paVar2 = (aligned_storage_t<sizeof(int),_alignof(int)> *)value(this_00);
    this_00->optionalValue = *paVar2;
    in_RDI->set = true;
    reset(this_00);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(optional &&v) {
        reset();
        if (v.has_value()) {
            new (ptr()) T(std::move(v.value()));
            set = true;
            v.reset();
        }
        return *this;
    }